

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::eval(Simulator *this)

{
  bool bVar1;
  UserException *this_00;
  reference __in;
  type *ppVVar2;
  type *ppSVar3;
  type *stmt;
  type *var;
  allocator<char> local_31;
  string local_30;
  Simulator *local_10;
  Simulator *this_local;
  
  this->simulation_depth_ = 0;
  local_10 = this;
  while( true ) {
    bVar1 = std::
            queue<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::deque<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>_>
            ::empty(&this->event_queue_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>
      ::clear(&this->scope_);
      return;
    }
    if (0xffffffff < this->simulation_depth_) break;
    __in = std::
           queue<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::deque<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>_>
           ::front(&this->event_queue_);
    ppVVar2 = std::get<0ul,kratos::Var_const*,kratos::Stmt*>(__in);
    ppSVar3 = std::get<1ul,kratos::Var_const*,kratos::Stmt*>(__in);
    std::
    queue<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::deque<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>_>
    ::pop(&this->event_queue_);
    process_stmt(this,*ppSVar3,*ppVVar2);
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Simulation doesn\'t converge",&local_31);
  UserException::UserException(this_00,&local_30);
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

void Simulator::eval() {
    simulation_depth_ = 0;
    while (!event_queue_.empty()) {
        if (simulation_depth_ > MAX_SIMULATION_DEPTH) {
            throw UserException("Simulation doesn't converge");
        }
        auto &[var, stmt] = event_queue_.front();
        event_queue_.pop();
        process_stmt(stmt, var);
    }
    scope_.clear();
}